

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::Instruction::InsertBefore
          (Instruction *this,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *list)

{
  pointer puVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  Instruction *pIVar4;
  pointer puVar5;
  pointer *__ptr;
  pointer puVar6;
  
  puVar5 = (list->
           super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (list->
           super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pIVar2 = (puVar5->_M_t).
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  while( true ) {
    if (puVar5 == puVar1) {
      puVar5 = (list->
               super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (list->
               super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      puVar6 = puVar5;
      if (puVar1 != puVar5) {
        do {
          pIVar3 = (puVar6->_M_t).
                   super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          if (pIVar3 != (Instruction *)0x0) {
            (**(code **)((long)(pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                               _vptr_IntrusiveNodeBase + 8))();
          }
          (puVar6->_M_t).
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
               (Instruction *)0x0;
          puVar6 = puVar6 + 1;
        } while (puVar6 != puVar1);
        (list->
        super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = puVar5;
      }
      return pIVar2;
    }
    pIVar3 = (puVar5->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    (puVar5->_M_t).
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
    if ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) break;
    if ((this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ == (Instruction *)0x0
       ) {
      __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xaf,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                   );
    }
    pIVar4 = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (pIVar4 != (Instruction *)0x0) {
      (pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar4;
      (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
      (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
    }
    (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = this;
    (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar3;
    (((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
    super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar3;
    puVar5 = puVar5 + 1;
  }
  __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                ,0xae,
                "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
               );
}

Assistant:

Instruction* Instruction::InsertBefore(
    std::vector<std::unique_ptr<Instruction>>&& list) {
  Instruction* first_node = list.front().get();
  for (auto& inst : list) {
    inst.release()->InsertBefore(this);
  }
  list.clear();
  return first_node;
}